

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O2

void JSON::writeArrayItem(Pipeline *p,bool *first,JSON *element,size_t depth)

{
  size_t __n;
  
  __n = depth;
  writeNext(p,first,depth);
  write(element,(int)p,(void *)depth,__n);
  return;
}

Assistant:

void
JSON::writeArrayItem(Pipeline* p, bool& first, JSON const& element, size_t depth)
{
    writeNext(p, first, depth);
    element.write(p, depth);
}